

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_countSeqStoreLiteralsBytes(seqStore_t *seqStore)

{
  seqDef sVar1;
  seqDef seq;
  size_t i;
  size_t nbSeqs;
  size_t literalsBytes;
  seqStore_t *seqStore_local;
  
  nbSeqs = 0;
  seq.offBase = 0;
  seq.litLength = 0;
  seq.mlBase = 0;
  for (; (ulong)seq < (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
      seq = (seqDef)((long)seq + 1)) {
    nbSeqs = ((ulong)seqStore->sequencesStart[(long)seq] >> 0x20 & 0xffff) + nbSeqs;
    sVar1.litLength = 0;
    sVar1.mlBase = 0;
    sVar1.offBase = seqStore->longLengthPos;
    if ((seq == sVar1) && (seqStore->longLengthType == ZSTD_llt_literalLength)) {
      nbSeqs = nbSeqs + 0x10000;
    }
  }
  return nbSeqs;
}

Assistant:

static size_t ZSTD_countSeqStoreLiteralsBytes(const seqStore_t* const seqStore)
{
    size_t literalsBytes = 0;
    size_t const nbSeqs = (size_t)(seqStore->sequences - seqStore->sequencesStart);
    size_t i;
    for (i = 0; i < nbSeqs; ++i) {
        seqDef const seq = seqStore->sequencesStart[i];
        literalsBytes += seq.litLength;
        if (i == seqStore->longLengthPos && seqStore->longLengthType == ZSTD_llt_literalLength) {
            literalsBytes += 0x10000;
    }   }
    return literalsBytes;
}